

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_ctl.c
# Opt level: O2

t_int * vline_tilde_perform(t_int *w)

{
  float fVar1;
  double dVar2;
  double dVar3;
  long lVar4;
  int iVar5;
  double *fatso;
  float *pfVar6;
  int iVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double local_58;
  
  lVar4 = w[1];
  pfVar6 = (float *)w[2];
  iVar5 = (int)w[3];
  local_58 = *(double *)(lVar4 + 0x30);
  dVar10 = *(double *)(lVar4 + 0x38);
  dVar2 = *(double *)(lVar4 + 0x60);
  dVar8 = clock_gettimesince(*(double *)(lVar4 + 0x40));
  fatso = *(double **)(lVar4 + 0x80);
  if ((dVar8 != *(double *)(lVar4 + 0x48)) || (NAN(dVar8) || NAN(*(double *)(lVar4 + 0x48)))) {
    iVar7 = 0x40;
    if (0x40 < iVar5) {
      iVar7 = iVar5;
    }
    *(double *)(lVar4 + 0x48) = dVar8;
    dVar8 = dVar8 - (double)iVar7 * dVar2;
  }
  else {
    dVar8 = *(double *)(lVar4 + 0x50);
  }
  *(double *)(lVar4 + 0x50) = (double)iVar5 * dVar2 + dVar8;
  iVar7 = 0;
  if (iVar5 < 1) {
    iVar5 = 0;
  }
  do {
    if (iVar7 == iVar5) {
      *(double *)(lVar4 + 0x30) = local_58;
      return w + 4;
    }
    dVar8 = dVar8 + dVar2;
    while (fatso != (double *)0x0) {
      dVar3 = fatso[1];
      dVar9 = *(double *)(lVar4 + 0x68);
      if (dVar8 <= dVar3) goto LAB_001196c9;
      if (dVar9 <= dVar8) {
        local_58 = (double)*(float *)(lVar4 + 0x70);
      }
      dVar9 = *fatso;
      fVar1 = *(float *)(fatso + 2);
      dVar11 = (double)fVar1;
      dVar10 = 0.0;
      if (dVar3 < dVar9) {
        dVar11 = (dVar11 - local_58) / (dVar9 - dVar3);
        dVar10 = dVar11 * dVar2;
        dVar11 = (dVar8 - dVar3) * dVar11 + local_58;
      }
      local_58 = dVar11;
      *(double *)(lVar4 + 0x38) = dVar10;
      *(float *)(lVar4 + 0x70) = fVar1;
      *(double *)(lVar4 + 0x68) = dVar9;
      *(double *)(lVar4 + 0x80) = fatso[3];
      freebytes(fatso,0x20);
      fatso = *(double **)(lVar4 + 0x80);
    }
    dVar9 = *(double *)(lVar4 + 0x68);
LAB_001196c9:
    if (dVar9 <= dVar8) {
      local_58 = (double)*(float *)(lVar4 + 0x70);
      *(undefined8 *)(lVar4 + 0x38) = 0;
      *(undefined8 *)(lVar4 + 0x68) = 0x4415af1d78b58c40;
      dVar10 = 0.0;
    }
    *pfVar6 = (float)local_58;
    pfVar6 = pfVar6 + 1;
    local_58 = local_58 + dVar10;
    iVar7 = iVar7 + 1;
  } while( true );
}

Assistant:

static t_int *vline_tilde_perform(t_int *w)
{
    t_vline *x = (t_vline *)(w[1]);
    t_sample *out = (t_sample *)(w[2]);
    int n = (int)(w[3]), i;
    double f = x->x_value;
    double inc = x->x_inc;
    double msecpersamp = x->x_msecpersamp;
    double timenow, logicaltimenow = clock_gettimesince(x->x_referencetime);
    t_vseg *s = x->x_list;
    if (logicaltimenow != x->x_lastlogicaltime)
    {
        int sampstotime = (n > DEFDACBLKSIZE ? n : DEFDACBLKSIZE);
        x->x_lastlogicaltime = logicaltimenow;
        x->x_nextblocktime = logicaltimenow - sampstotime * msecpersamp;
    }
    timenow = x->x_nextblocktime;
    x->x_nextblocktime = timenow + n * msecpersamp;
    for (i = 0; i < n; i++)
    {
        double timenext = timenow + msecpersamp;
    checknext:
        if (s)
        {
            /* has starttime elapsed?  If so update value and increment */
            if (s->s_starttime < timenext)
            {
                if (x->x_targettime <= timenext)
                    f = x->x_target, inc = 0;
                    /* if zero-length segment bash output value */
                if (s->s_targettime <= s->s_starttime)
                {
                    f = s->s_target;
                    inc = 0;
                }
                else
                {
                    double incpermsec = (s->s_target - f)/
                        (s->s_targettime - s->s_starttime);
                    f = f + incpermsec * (timenext - s->s_starttime);
                    inc = incpermsec * msecpersamp;
                }
                x->x_inc = inc;
                x->x_target = s->s_target;
                x->x_targettime = s->s_targettime;
                x->x_list = s->s_next;
                t_freebytes(s, sizeof(*s));
                s = x->x_list;
                goto checknext;
            }
        }
        if (x->x_targettime <= timenext)
            f = x->x_target, inc = x->x_inc = 0, x->x_targettime = 1e20;
        *out++ = f;
        f = f + inc;
        timenow = timenext;
    }
    x->x_value = f;
    return (w+4);
}